

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deUniquePtr.hpp
# Opt level: O0

void __thiscall
de::details::
UniqueBase<vkt::memory::(anonymous_namespace)::Memory,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory>_>
::reset(UniqueBase<vkt::memory::(anonymous_namespace)::Memory,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory>_>
        *this)

{
  UniqueBase<vkt::memory::(anonymous_namespace)::Memory,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory>_>
  *this_local;
  
  if ((this->m_data).ptr != (Memory *)0x0) {
    DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory>::operator()
              ((DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory> *)
               &(this->m_data).field_0x8,(this->m_data).ptr);
    (this->m_data).ptr = (Memory *)0x0;
  }
  return;
}

Assistant:

void UniqueBase<T, D>::reset (void)
{
	if (m_data.ptr != DE_NULL)
	{
		m_data.deleter(m_data.ptr);
		m_data.ptr = DE_NULL;
	}
}